

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O1

void tif_9uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  
  uVar10 = 0;
  if ((length & 0xfffffffffffffff8) != 0) {
    do {
      bVar1 = *pSrc;
      bVar2 = pSrc[1];
      bVar3 = pSrc[2];
      bVar4 = pSrc[3];
      bVar5 = pSrc[4];
      bVar6 = pSrc[5];
      bVar7 = pSrc[6];
      bVar8 = pSrc[7];
      bVar9 = pSrc[8];
      pSrc = pSrc + 9;
      pDst[uVar10] = (uint)(bVar2 >> 7) + (uint)bVar1 * 2;
      pDst[uVar10 + 1] = (uint)(bVar3 >> 6) + (bVar2 & 0x7f) * 4;
      pDst[uVar10 + 2] = (uint)(bVar4 >> 5) + (bVar3 & 0x3f) * 8;
      pDst[uVar10 + 3] = (uint)(bVar5 >> 4) | (bVar4 & 0x1f) << 4;
      pDst[uVar10 + 4] = (uint)(bVar6 >> 3) | (bVar5 & 0xf) << 5;
      pDst[uVar10 + 5] = (uint)(bVar7 >> 2) | (bVar6 & 7) << 6;
      pDst[uVar10 + 6] = (uint)(bVar8 >> 1) | (bVar7 & 3) << 7;
      pDst[uVar10 + 7] = (bVar8 & 1) << 8 | (uint)bVar9;
      uVar10 = uVar10 + 8;
    } while (uVar10 < (length & 0xfffffffffffffff8));
  }
  if ((length & 7) != 0) {
    bVar1 = pSrc[1];
    pDst[uVar10] = (uint)(bVar1 >> 7) + (uint)*pSrc * 2;
    uVar11 = (uint)(length & 7);
    if (uVar11 != 1) {
      bVar2 = pSrc[2];
      pDst[uVar10 + 1] = (uint)(bVar2 >> 6) + (bVar1 & 0x7f) * 4;
      if (2 < uVar11) {
        bVar1 = pSrc[3];
        pDst[uVar10 + 2] = (uint)(bVar1 >> 5) + (bVar2 & 0x3f) * 8;
        if (uVar11 != 3) {
          bVar2 = pSrc[4];
          pDst[uVar10 + 3] = (uint)(bVar2 >> 4) | (bVar1 & 0x1f) << 4;
          if (4 < uVar11) {
            bVar1 = pSrc[5];
            pDst[uVar10 + 4] = (uint)(bVar1 >> 3) | (bVar2 & 0xf) << 5;
            if (uVar11 != 5) {
              bVar2 = pSrc[6];
              pDst[uVar10 + 5] = (uint)(bVar2 >> 2) | (bVar1 & 7) << 6;
              if (uVar11 == 7) {
                pDst[uVar10 + 6] = (uint)(pSrc[7] >> 1) | (bVar2 & 3) << 7;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_9uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                        OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;
        OPJ_UINT32 val5 = *pSrc++;
        OPJ_UINT32 val6 = *pSrc++;
        OPJ_UINT32 val7 = *pSrc++;
        OPJ_UINT32 val8 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 1) | (val1 >> 7));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0x7FU) << 2) | (val2 >> 6));
        pDst[i + 2] = (OPJ_INT32)(((val2 & 0x3FU) << 3) | (val3 >> 5));
        pDst[i + 3] = (OPJ_INT32)(((val3 & 0x1FU) << 4) | (val4 >> 4));
        pDst[i + 4] = (OPJ_INT32)(((val4 & 0xFU) << 5) | (val5 >> 3));
        pDst[i + 5] = (OPJ_INT32)(((val5 & 0x7U) << 6) | (val6 >> 2));
        pDst[i + 6] = (OPJ_INT32)(((val6 & 0x3U) << 7) | (val7 >> 1));
        pDst[i + 7] = (OPJ_INT32)(((val7 & 0x1U) << 8) | (val8));

    }
    if (length & 7U) {
        unsigned int val;
        int available = 0;

        length = length & 7U;

        GETBITS(pDst[i + 0], 9)

        if (length > 1U) {
            GETBITS(pDst[i + 1], 9)
            if (length > 2U) {
                GETBITS(pDst[i + 2], 9)
                if (length > 3U) {
                    GETBITS(pDst[i + 3], 9)
                    if (length > 4U) {
                        GETBITS(pDst[i + 4], 9)
                        if (length > 5U) {
                            GETBITS(pDst[i + 5], 9)
                            if (length > 6U) {
                                GETBITS(pDst[i + 6], 9)
                            }
                        }
                    }
                }
            }
        }
    }
}